

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trans_rvd.inc.c
# Opt level: O0

_Bool trans_fsgnj_d(DisasContext_conflict12 *ctx,arg_fsgnj_d *a)

{
  TCGContext_conflict11 *tcg_ctx_00;
  TCGContext_conflict11 *tcg_ctx;
  arg_fsgnj_d *a_local;
  DisasContext_conflict12 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  if (a->rs1 == a->rs2) {
    tcg_gen_mov_i64_riscv64(tcg_ctx_00,tcg_ctx_00->cpu_fpr[a->rd],tcg_ctx_00->cpu_fpr[a->rs1]);
  }
  else {
    tcg_gen_deposit_i64_riscv64
              (tcg_ctx_00,tcg_ctx_00->cpu_fpr[a->rd],tcg_ctx_00->cpu_fpr[a->rs2],
               tcg_ctx_00->cpu_fpr[a->rs1],0,0x3f);
  }
  mark_fs_dirty(ctx);
  return true;
}

Assistant:

static bool trans_fsgnj_d(DisasContext *ctx, arg_fsgnj_d *a)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    if (a->rs1 == a->rs2) { /* FMOV */
        tcg_gen_mov_i64(tcg_ctx, tcg_ctx->cpu_fpr[a->rd], tcg_ctx->cpu_fpr[a->rs1]);
    } else {
        tcg_gen_deposit_i64(tcg_ctx, tcg_ctx->cpu_fpr[a->rd], tcg_ctx->cpu_fpr[a->rs2],
                            tcg_ctx->cpu_fpr[a->rs1], 0, 63);
    }
    mark_fs_dirty(ctx);
    return true;
}